

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O0

void CMU462::make_coord_space(Matrix3x3 *o2w,Vector3D *n)

{
  Vector3D *pVVar1;
  undefined1 local_78 [8];
  Vector3D x;
  Vector3D y;
  Vector3D h;
  Vector3D z;
  Vector3D *n_local;
  Matrix3x3 *o2w_local;
  
  Vector3D::Vector3D((Vector3D *)&h.z,n->x,n->y,n->z);
  Vector3D::Vector3D((Vector3D *)&y.z,(Vector3D *)&h.z);
  if ((ABS(h.x) < ABS(y.z)) || (ABS(h.y) < ABS(y.z))) {
    if ((ABS(y.z) < ABS(h.x)) || (ABS(h.y) < ABS(h.x))) {
      h.y = 1.0;
    }
    else {
      h.x = 1.0;
    }
  }
  else {
    y.z = 1.0;
  }
  Vector3D::normalize((Vector3D *)&h.z);
  cross((Vector3D *)&x.z,(Vector3D *)&y.z,(Vector3D *)&h.z);
  Vector3D::normalize((Vector3D *)&x.z);
  cross((Vector3D *)local_78,(Vector3D *)&h.z,(Vector3D *)&x.z);
  Vector3D::normalize((Vector3D *)local_78);
  pVVar1 = Matrix3x3::operator[](o2w,0);
  pVVar1->x = (double)local_78;
  pVVar1->y = x.x;
  pVVar1->z = x.y;
  pVVar1 = Matrix3x3::operator[](o2w,1);
  pVVar1->x = x.z;
  pVVar1->y = y.x;
  pVVar1->z = y.y;
  pVVar1 = Matrix3x3::operator[](o2w,2);
  pVVar1->x = h.z;
  pVVar1->y = z.x;
  pVVar1->z = z.y;
  return;
}

Assistant:

void make_coord_space(Matrix3x3& o2w, const Vector3D& n) {

    Vector3D z = Vector3D(n.x, n.y, n.z);
    Vector3D h = z;
    if (fabs(h.x) <= fabs(h.y) && fabs(h.x) <= fabs(h.z)) h.x = 1.0;
    else if (fabs(h.y) <= fabs(h.x) && fabs(h.y) <= fabs(h.z)) h.y = 1.0;
    else h.z = 1.0;

    z.normalize();
    Vector3D y = cross(h, z);
    y.normalize();
    Vector3D x = cross(z, y);
    x.normalize();

    o2w[0] = x;
    o2w[1] = y;
    o2w[2] = z;
  }